

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFill.cpp
# Opt level: O1

bool __thiscall CDirectiveFill::Validate(CDirectiveFill *this)

{
  bool bVar1;
  undefined8 in_RAX;
  u64 uVar2;
  int NewSize;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  uVar2 = FileManager::getVirtualAddress(g_fileManager);
  this->RamPos = uVar2;
  bVar1 = evalExpression(&this->SizeExpression,(int *)&local_14,true);
  if ((bVar1) &&
     (((this->FillByte != true ||
       (bVar1 = evalExpression(&this->ByteExpression,&this->Byte,true), bVar1)) &&
      (FileManager::advanceMemory(g_fileManager,(long)(int)local_14),
      this->Size != (long)(int)local_14)))) {
    this->Size = (ulong)local_14;
    return true;
  }
  return false;
}

Assistant:

bool CDirectiveFill::Validate()
{
	int NewSize;

	RamPos = g_fileManager->getVirtualAddress();
	if (evalExpression(SizeExpression,NewSize,true) == false)
		return false;

	if (FillByte == true)
	{
		if (evalExpression(ByteExpression,Byte,true) == false)
			return false;
	}

	g_fileManager->advanceMemory(NewSize);

	if (Size != NewSize)
	{
		Size = (u32)NewSize;
		return true;
	} else {
		return false;
	}
}